

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O0

int Io_ReadBlifReorderFormalNames(Vec_Ptr_t *vTokens,Mio_Gate_t *pGate,Mio_Gate_t *pTwin)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *pcVar5;
  void *pvVar6;
  int Length;
  int nSize;
  int k;
  int i;
  char *pNamePin;
  char *pName;
  Mio_Pin_t *pGatePin;
  Mio_Gate_t *pTwin_local;
  Mio_Gate_t *pGate_local;
  Vec_Ptr_t *vTokens_local;
  
  iVar1 = Vec_PtrSize(vTokens);
  if (pTwin == (Mio_Gate_t *)0x0) {
    iVar2 = Mio_GateReadPinNum(pGate);
    if (iVar1 + -3 != iVar2) {
      return 0;
    }
  }
  else {
    iVar2 = Mio_GateReadPinNum(pGate);
    if ((iVar1 + -3 != iVar2) && (iVar2 = Mio_GateReadPinNum(pGate), iVar1 + -4 != iVar2)) {
      return 0;
    }
  }
  pName = (char *)Mio_GateReadPins(pGate);
  nSize = 0;
  while (pName != (char *)0x0) {
    pcVar3 = Mio_PinReadName((Mio_Pin_t *)pName);
    sVar4 = strlen(pcVar3);
    pcVar5 = (char *)Vec_PtrEntry(vTokens,nSize + 2);
    iVar2 = strncmp(pcVar3,pcVar5,(long)(int)sVar4);
    if ((iVar2 != 0) || (pcVar5[(int)sVar4] != '=')) break;
    pName = (char *)Mio_PinReadNext((Mio_Pin_t *)pName);
    nSize = nSize + 1;
  }
  if (pTwin == (Mio_Gate_t *)0x0) {
    iVar2 = Mio_GateReadPinNum(pGate);
    if (nSize == iVar2) {
      vTokens_local._4_4_ = 1;
    }
    else {
      for (pName = (char *)Mio_GateReadPins(pGate); pName != (char *)0x0;
          pName = (char *)Mio_PinReadNext((Mio_Pin_t *)pName)) {
        pcVar3 = Mio_PinReadName((Mio_Pin_t *)pName);
        sVar4 = strlen(pcVar3);
        for (Length = 2; Length < iVar1; Length = Length + 1) {
          pcVar5 = (char *)Vec_PtrEntry(vTokens,Length);
          iVar2 = strncmp(pcVar3,pcVar5,(long)(int)sVar4);
          if ((iVar2 == 0) && (pcVar5[(int)sVar4] == '=')) {
            Vec_PtrPush(vTokens,pcVar5);
            break;
          }
        }
      }
      pcVar3 = Mio_GateReadOutName(pGate);
      sVar4 = strlen(pcVar3);
      for (Length = 2; Length < iVar1; Length = Length + 1) {
        pcVar5 = (char *)Vec_PtrEntry(vTokens,Length);
        iVar2 = strncmp(pcVar3,pcVar5,(long)(int)sVar4);
        if ((iVar2 == 0) && (pcVar5[(int)sVar4] == '=')) {
          Vec_PtrPush(vTokens,pcVar5);
          break;
        }
      }
      iVar2 = Vec_PtrSize(vTokens);
      Length = iVar1;
      if (iVar2 - iVar1 == iVar1 + -2) {
        for (; iVar2 = Vec_PtrSize(vTokens), Length < iVar2; Length = Length + 1) {
          pvVar6 = Vec_PtrEntry(vTokens,Length);
          Vec_PtrWriteEntry(vTokens,(Length - iVar1) + 2,pvVar6);
        }
        Vec_PtrShrink(vTokens,iVar1);
        vTokens_local._4_4_ = 1;
      }
      else {
        vTokens_local._4_4_ = 0;
      }
    }
  }
  else {
    iVar2 = Mio_GateReadPinNum(pGate);
    if (nSize == iVar2) {
      iVar2 = Mio_GateReadPinNum(pGate);
      if (iVar1 + -3 == iVar2) {
        pcVar3 = Mio_GateReadOutName(pGate);
        sVar4 = strlen(pcVar3);
        pcVar5 = (char *)Vec_PtrEntry(vTokens,iVar1 + -1);
        iVar2 = strncmp(pcVar3,pcVar5,(long)(int)sVar4);
        if ((iVar2 == 0) && (pcVar5[(int)sVar4] == '=')) {
          Vec_PtrPush(vTokens,(void *)0x0);
          vTokens_local._4_4_ = 1;
        }
        else {
          pcVar3 = Mio_GateReadOutName(pTwin);
          sVar4 = strlen(pcVar3);
          pcVar5 = (char *)Vec_PtrEntry(vTokens,iVar1 + -1);
          iVar1 = strncmp(pcVar3,pcVar5,(long)(int)sVar4);
          if ((iVar1 == 0) && (pcVar5[(int)sVar4] == '=')) {
            pvVar6 = Vec_PtrPop(vTokens);
            Vec_PtrPush(vTokens,(void *)0x0);
            Vec_PtrPush(vTokens,pvVar6);
            vTokens_local._4_4_ = 1;
          }
          else {
            vTokens_local._4_4_ = 0;
          }
        }
      }
      else {
        iVar2 = Mio_GateReadPinNum(pGate);
        if (iVar1 + -4 != iVar2) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioReadBlif.c"
                        ,0x295,
                        "int Io_ReadBlifReorderFormalNames(Vec_Ptr_t *, Mio_Gate_t *, Mio_Gate_t *)"
                       );
        }
        pcVar3 = Mio_GateReadOutName(pGate);
        sVar4 = strlen(pcVar3);
        pcVar5 = (char *)Vec_PtrEntry(vTokens,iVar1 + -2);
        iVar2 = strncmp(pcVar3,pcVar5,(long)(int)sVar4);
        if ((iVar2 == 0) && (pcVar5[(int)sVar4] == '=')) {
          pcVar3 = Mio_GateReadOutName(pTwin);
          sVar4 = strlen(pcVar3);
          pcVar5 = (char *)Vec_PtrEntry(vTokens,iVar1 + -1);
          iVar1 = strncmp(pcVar3,pcVar5,(long)(int)sVar4);
          if ((iVar1 == 0) && (pcVar5[(int)sVar4] == '=')) {
            vTokens_local._4_4_ = 1;
          }
          else {
            vTokens_local._4_4_ = 0;
          }
        }
        else {
          vTokens_local._4_4_ = 0;
        }
      }
    }
    else {
      vTokens_local._4_4_ = 0;
    }
  }
  return vTokens_local._4_4_;
}

Assistant:

int Io_ReadBlifReorderFormalNames( Vec_Ptr_t * vTokens, Mio_Gate_t * pGate, Mio_Gate_t * pTwin )
{
    Mio_Pin_t * pGatePin;
    char * pName, * pNamePin;
    int i, k, nSize, Length;
    nSize = Vec_PtrSize(vTokens);
    if ( pTwin == NULL )
    {
        if ( nSize - 3 != Mio_GateReadPinNum(pGate) )
            return 0;
    }
    else
    {
        if ( nSize - 3 != Mio_GateReadPinNum(pGate) && nSize - 4 != Mio_GateReadPinNum(pGate) )
            return 0;
    }
    // check if the names are in order
    for ( pGatePin = Mio_GateReadPins(pGate), i = 0; pGatePin; pGatePin = Mio_PinReadNext(pGatePin), i++ )
    {
        pNamePin = Mio_PinReadName(pGatePin);
        Length = strlen(pNamePin);
        pName = (char *)Vec_PtrEntry(vTokens, i+2);
        if ( !strncmp( pNamePin, pName, Length ) && pName[Length] == '=' )
            continue;
        break;
    }
    if ( pTwin == NULL )
    {
        if ( i == Mio_GateReadPinNum(pGate) )
            return 1;
        // reorder the pins
        for ( pGatePin = Mio_GateReadPins(pGate), i = 0; pGatePin; pGatePin = Mio_PinReadNext(pGatePin), i++ )
        {
            pNamePin = Mio_PinReadName(pGatePin);
            Length = strlen(pNamePin);
            for ( k = 2; k < nSize; k++ )
            {
                pName = (char *)Vec_PtrEntry(vTokens, k);
                if ( !strncmp( pNamePin, pName, Length ) && pName[Length] == '=' )
                {
                    Vec_PtrPush( vTokens, pName );
                    break;
                }
            }
        }
        pNamePin = Mio_GateReadOutName(pGate);
        Length = strlen(pNamePin);
        for ( k = 2; k < nSize; k++ )
        {
            pName = (char *)Vec_PtrEntry(vTokens, k);
            if ( !strncmp( pNamePin, pName, Length ) && pName[Length] == '=' )
            {
                Vec_PtrPush( vTokens, pName );
                break;
            }
        }
        if ( Vec_PtrSize(vTokens) - nSize != nSize - 2 )
            return 0;
        Vec_PtrForEachEntryStart( char *, vTokens, pName, k, nSize )
            Vec_PtrWriteEntry( vTokens, k - nSize + 2, pName );
        Vec_PtrShrink( vTokens, nSize );
    }
    else
    {
        if ( i != Mio_GateReadPinNum(pGate) ) // expect the correct order of input pins in the network with twin gates
            return 0;
        // check the last two entries
        if ( nSize - 3 == Mio_GateReadPinNum(pGate) ) // only one output is available
        {
            pNamePin = Mio_GateReadOutName(pGate);
            Length = strlen(pNamePin);
            pName = (char *)Vec_PtrEntry(vTokens, nSize - 1);
            if ( !strncmp( pNamePin, pName, Length ) && pName[Length] == '=' ) // the last entry is pGate
            {
                Vec_PtrPush( vTokens, NULL );
                return 1;
            }
            pNamePin = Mio_GateReadOutName(pTwin);
            Length = strlen(pNamePin);
            pName = (char *)Vec_PtrEntry(vTokens, nSize - 1);
            if ( !strncmp( pNamePin, pName, Length ) && pName[Length] == '=' ) // the last entry is pTwin
            {
                pName = (char *)Vec_PtrPop( vTokens );
                Vec_PtrPush( vTokens, NULL );
                Vec_PtrPush( vTokens, pName );
                return 1;
            }
            return 0;
        }
        if ( nSize - 4 == Mio_GateReadPinNum(pGate) ) // two outputs are available
        {
            pNamePin = Mio_GateReadOutName(pGate);
            Length = strlen(pNamePin);
            pName = (char *)Vec_PtrEntry(vTokens, nSize - 2);
            if ( !(!strncmp( pNamePin, pName, Length ) && pName[Length] == '=') )
                return 0;
            pNamePin = Mio_GateReadOutName(pTwin);
            Length = strlen(pNamePin);
            pName = (char *)Vec_PtrEntry(vTokens, nSize - 1);
            if ( !(!strncmp( pNamePin, pName, Length ) && pName[Length] == '=') )
                return 0;
            return 1;
        }
        assert( 0 );
    }
    return 1;
}